

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall World::clean_unused_blocksets(World *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pvVar3;
  Blockset *pBVar4;
  Blockset *pBVar5;
  void *pvVar6;
  _Base_ptr p_Var7;
  pointer ppBVar8;
  pointer ppBVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  pointer __src;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  vector<Blockset_*,_std::allocator<Blockset_*>_> *blockset_group;
  pointer pvVar14;
  set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> used_blocksets;
  _Base_ptr local_68;
  _Rb_tree<Blockset_*,_Blockset_*,_std::_Identity<Blockset_*>,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (this->_maps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->_maps)._M_t._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_68 = (p_Var7[1]._M_parent)->_M_left;
      std::
      _Rb_tree<Blockset*,Blockset*,std::_Identity<Blockset*>,std::less<Blockset*>,std::allocator<Blockset*>>
      ::_M_insert_unique<Blockset*>
                ((_Rb_tree<Blockset*,Blockset*,std::_Identity<Blockset*>,std::less<Blockset*>,std::allocator<Blockset*>>
                  *)&local_60,(Blockset **)&local_68);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  pvVar14 = (this->_blockset_groups).
            super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->_blockset_groups).
           super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar14 != pvVar3) {
    do {
      ppBVar8 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppBVar9 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (8 < (ulong)((long)ppBVar9 - (long)ppBVar8)) {
        uVar10 = 1;
        do {
          pBVar4 = ppBVar8[uVar10];
          p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = &p_Var2->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001d833d:
            __src = ppBVar8 + (long)(int)uVar10 + 1;
            if (__src != ppBVar9) {
              memmove(ppBVar8 + (int)uVar10,__src,(long)ppBVar9 - (long)__src);
              ppBVar9 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
            super__Vector_impl_data._M_finish = ppBVar9 + -1;
            if ((pBVar4 != (Blockset *)0x0) &&
               (pvVar6 = *(void **)&(pBVar4->_blocks).
                                    super__Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                                    ._M_impl, pvVar6 != (void *)0x0)) {
              operator_delete(pvVar6,(long)*(pointer *)
                                            ((long)&(pBVar4->_blocks).
                                                                                                        
                                                  super__Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                                                  ._M_impl + 0x10) - (long)pvVar6);
            }
            operator_delete(pBVar4,0x18);
            uVar10 = uVar10 - 1;
            ppBVar8 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            ppBVar9 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          }
          else {
            do {
              p_Var12 = p_Var13;
              p_Var11 = p_Var7;
              pBVar5 = *(Blockset **)(p_Var11 + 1);
              p_Var13 = p_Var11;
              if (pBVar5 < pBVar4) {
                p_Var13 = p_Var12;
              }
              p_Var7 = (&p_Var11->_M_left)[pBVar5 < pBVar4];
            } while ((&p_Var11->_M_left)[pBVar5 < pBVar4] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var13 == p_Var2) goto LAB_001d833d;
            if (pBVar5 < pBVar4) {
              p_Var11 = p_Var12;
            }
            if (pBVar4 < *(Blockset **)(p_Var11 + 1)) goto LAB_001d833d;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)ppBVar9 - (long)ppBVar8 >> 3));
      }
      pvVar14 = pvVar14 + 1;
    } while (pvVar14 != pvVar3);
    pvVar3 = (this->_blockset_groups).
             super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar14 = (this->_blockset_groups).
                   super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar3;
        pvVar14 = pvVar14 + 1) {
      ppBVar8 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)(pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppBVar8 == 8) {
        pBVar4 = *ppBVar8;
        if ((pBVar4 != (Blockset *)0x0) &&
           (pvVar6 = *(void **)&(pBVar4->_blocks).
                                super__Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                                ._M_impl, pvVar6 != (void *)0x0)) {
          operator_delete(pvVar6,(long)*(pointer *)
                                        ((long)&(pBVar4->_blocks).
                                                super__Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                                                ._M_impl + 0x10) - (long)pvVar6);
        }
        operator_delete(pBVar4,0x18);
        ppBVar8 = (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppBVar8) {
          (pvVar14->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
          super__Vector_impl_data._M_finish = ppBVar8;
        }
      }
    }
  }
  std::
  _Rb_tree<Blockset_*,_Blockset_*,_std::_Identity<Blockset_*>,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void World::clean_unused_blocksets()
{
    std::set<Blockset*> used_blocksets;
    for(auto& [id, map] : _maps)
        used_blocksets.insert(map->blockset());

    // Iterate over all secondary blocksets, and remove unused ones
    for(auto& blockset_group : _blockset_groups)
    {
        // Only start from one to exclude primary blocksets (which are never directly referenced)
        // Primary blocksets are removed only if all linked secondary blocksets are removed as well
        for(size_t j=1 ; j<blockset_group.size() ; ++j)
        {
            Blockset* blockset = blockset_group[j];
            if(!used_blocksets.count(blockset))
            {
                blockset_group.erase(blockset_group.begin() + (int)j);
                delete blockset;
                --j;
            }
        }
    }

    // Empty eventual blockset groups where only the primary blockset remains (no secondary blockset in the group)
    for(auto& blockset_group : _blockset_groups)
    {
        if(blockset_group.size() == 1)
        {
            delete blockset_group[0];
            blockset_group.clear();
        }
    }
}